

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O0

bc_slist_t * bc_slist_sort(bc_slist_t *l,bc_sort_func_t cmp)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  void *tmp;
  bc_slist_t *rptr;
  bc_slist_t *lptr;
  _Bool swapped;
  bc_sort_func_t cmp_local;
  bc_slist_t *l_local;
  
  if (l == (bc_slist_t *)0x0) {
    l_local = (bc_slist_t *)0x0;
  }
  else {
    tmp = (void *)0x0;
    do {
      bVar2 = false;
      for (rptr = l; rptr->next != (_bc_slist_t *)tmp; rptr = rptr->next) {
        iVar3 = (*cmp)(rptr->data,rptr->next->data);
        if (0 < iVar3) {
          pvVar1 = rptr->data;
          rptr->data = rptr->next->data;
          rptr->next->data = pvVar1;
          bVar2 = true;
        }
      }
      tmp = rptr;
      l_local = l;
    } while (bVar2);
  }
  return l_local;
}

Assistant:

bc_slist_t*
bc_slist_sort(bc_slist_t *l, bc_sort_func_t cmp)
{
    if (l == NULL) {
        return NULL;
    }

    bool swapped = false;
    bc_slist_t *lptr = NULL;
    bc_slist_t *rptr = NULL;

    do {
        swapped = false;
        lptr = l;

        while (lptr->next != rptr) {
            if (0 < cmp(lptr->data, lptr->next->data)) {
                void *tmp = lptr->data;
                lptr->data = lptr->next->data;
                lptr->next->data = tmp;
                swapped = true;
            }

            lptr = lptr->next;
        }

        rptr = lptr;
    } while(swapped);

    return l;
}